

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O0

void lts2::RealReconstructionWithIHT
               (Mat *X,LBDOperator *LBD,Mat *realDescriptor,int iterations,float sparsityCoeff,
               Size *patchSize,float patchMean,int norm,string *wavelet)

{
  LBDOperator *pLVar1;
  int iVar2;
  _InputArray *p_Var3;
  ostream *poVar4;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [12];
  double local_458;
  int local_444;
  _InputOutputArray local_428;
  _InputArray local_410;
  double local_3f8;
  _InputArray local_3f0;
  float local_3d4;
  double dStack_3d0;
  float norm_x;
  double local_3c8;
  _InputArray local_3c0;
  float local_3a4;
  int local_3a0;
  float norm_error;
  int iter;
  bool hasConverged;
  _InputArray local_390;
  float local_374;
  undefined1 local_370 [4];
  float norm_x_1;
  _InputArray local_350;
  Size_<int> local_338;
  Rect_<int> local_330;
  Mat local_320 [96];
  Mat local_2c0 [8];
  Mat C0;
  Scalar_<double> local_260;
  _InputArray local_240;
  Size_<int> local_224;
  int local_21c;
  int local_218;
  int wh;
  int ww;
  int fsize;
  double *Q;
  double *P;
  Mat nablaJ;
  Mat local_1a0 [8];
  Mat Ax;
  undefined1 local_140 [8];
  Mat X_im;
  Scalar_<double> local_e0;
  _InputArray local_c0;
  Size_<int> local_a8;
  int local_a0;
  float local_9c;
  int K;
  float tau;
  int M;
  undefined4 local_6c;
  undefined8 local_68;
  allocator local_59;
  string local_58 [32];
  int local_38;
  float local_34;
  int norm_local;
  float patchMean_local;
  Size *patchSize_local;
  float sparsityCoeff_local;
  int iterations_local;
  Mat *realDescriptor_local;
  LBDOperator *LBD_local;
  Mat *X_local;
  
  local_38 = norm;
  local_34 = patchMean;
  _norm_local = patchSize;
  patchSize_local._0_4_ = sparsityCoeff;
  patchSize_local._4_4_ = iterations;
  _sparsityCoeff_local = realDescriptor;
  realDescriptor_local = (Mat *)LBD;
  LBD_local = (LBDOperator *)X;
  if ((norm == 2) || (norm == 4)) {
    iVar2 = cv::Mat::type(realDescriptor);
    if (iVar2 == 5) {
      if (*(int *)(_sparsityCoeff_local + 8) < *(int *)(_sparsityCoeff_local + 0xc)) {
        local_444 = *(int *)(_sparsityCoeff_local + 0xc);
      }
      else {
        local_444 = *(int *)(_sparsityCoeff_local + 8);
      }
      K = local_444;
      if (local_38 == 4) {
        local_9c = 1.0 / (float)local_444;
      }
      else {
        local_9c = 0.5 / (float)local_444;
      }
      if (patchSize_local._0_4_ <= 1.0) {
        local_458 = (double)patchSize_local._0_4_;
      }
      else {
        local_458 = 1.0;
      }
      if (0.0 <= local_458) {
        fVar5 = patchSize_local._0_4_;
        if (1.0 < patchSize_local._0_4_) {
          fVar5 = 1.0;
        }
      }
      else {
        fVar5 = 0.0;
      }
      patchSize_local._0_4_ = fVar5;
      iVar2 = cv::Size_<int>::area(patchSize);
      fVar5 = rintf(fVar5 * (float)iVar2);
      pLVar1 = LBD_local;
      local_a0 = (int)fVar5;
      cv::Size_<int>::Size_(&local_a8,patchSize);
      cv::Mat::create(pLVar1,&local_a8,5);
      pLVar1 = LBD_local;
      cv::Scalar_<double>::Scalar_(&local_e0,0.0);
      cv::_InputArray::_InputArray<double,4,1>(&local_c0,(Matx<double,_4,_1> *)&local_e0);
      cv::noArray();
      cv::Mat::setTo((_InputArray *)pLVar1,&local_c0);
      cv::_InputArray::~_InputArray(&local_c0);
      cv::Mat::Mat((Mat *)local_140);
      cv::Mat::Mat(local_1a0);
      cv::Mat::Mat((Mat *)&P);
      Q = (double *)0x0;
      _ww = (double *)0x0;
      wh = 0;
      WaveletCoef(wavelet,&Q,(double **)&ww,&wh);
      cv::Size_<int>::Size_(&local_224,patchSize);
      cv::Mat::create(local_140,&local_224,5);
      cv::Scalar_<double>::Scalar_(&local_260,(double)local_34);
      cv::_InputArray::_InputArray<double,4,1>(&local_240,(Matx<double,_4,_1> *)&local_260);
      cv::noArray();
      cv::Mat::setTo((_InputArray *)local_140,&local_240);
      cv::_InputArray::~_InputArray(&local_240);
      WaveletTransform2D((Mat *)local_140,(Mat *)LBD_local,Q,_ww,wh,&local_218,&local_21c,-1);
      pLVar1 = LBD_local;
      cv::Rect_<int>::Rect_(&local_330,0,0,local_218,local_21c);
      cv::Mat::operator()(local_320,(Rect *)pLVar1);
      cv::Mat::clone();
      cv::Mat::~Mat(local_320);
      InverseWaveletTransform2D((Mat *)LBD_local,(Mat *)local_140,Q,_ww,wh,&local_218,&local_21c);
      pLVar1 = LBD_local;
      cv::Size_<int>::Size_(&local_338,patchSize);
      cv::Mat::create(pLVar1,&local_338,5);
      pLVar1 = LBD_local;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_370,0.0);
      cv::_InputArray::_InputArray<double,4,1>(&local_350,(Matx<double,_4,_1> *)local_370);
      cv::noArray();
      cv::Mat::setTo((_InputArray *)pLVar1,&local_350);
      cv::_InputArray::~_InputArray(&local_350);
      if (local_38 == 4) {
        (**(code **)(*(long *)realDescriptor_local + 0x18))
                  (realDescriptor_local,_sparsityCoeff_local,local_140);
        WaveletTransform2D((Mat *)local_140,(Mat *)LBD_local,Q,_ww,wh,&local_218,&local_21c,-1);
        cv::_InputArray::_InputArray(&local_390,(Mat *)LBD_local);
        p_Var3 = (_InputArray *)cv::noArray();
        dVar6 = (double)cv::norm(&local_390,4,p_Var3);
        fVar5 = (float)dVar6;
        cv::_InputArray::~_InputArray(&local_390);
        local_374 = fVar5;
        if (0.0 < fVar5) {
          _iter = (double)fVar5;
          cv::operator/=((Mat *)LBD_local,(double *)&iter);
        }
      }
      local_3a0 = 0;
      norm_error._3_1_ = false;
      while (((norm_error._3_1_ ^ 0xff) & 1) != 0) {
        InverseWaveletTransform2D((Mat *)LBD_local,(Mat *)local_140,Q,_ww,wh,&local_218,&local_21c);
        (**(code **)(*(long *)realDescriptor_local + 0x10))
                  (realDescriptor_local,local_140,local_1a0);
        cv::operator-=(local_1a0,_sparsityCoeff_local);
        if (local_38 == 2) {
          cv::_InputArray::_InputArray(&local_3c0,local_1a0);
          p_Var3 = (_InputArray *)cv::noArray();
          dVar6 = (double)cv::norm(&local_3c0,4,p_Var3);
          cv::_InputArray::~_InputArray(&local_3c0);
          local_3a4 = (float)dVar6;
          if ((float)dVar6 <= 1e-06) {
            local_3a4 = 1.0;
          }
          local_3c8 = (double)local_3a4;
          cv::operator/=(local_1a0,&local_3c8);
        }
        (**(code **)(*(long *)realDescriptor_local + 0x18))
                  (realDescriptor_local,local_1a0,local_140);
        WaveletTransform2D((Mat *)local_140,(Mat *)&P,Q,_ww,wh,&local_218,&local_21c,-1);
        dStack_3d0 = (double)local_9c;
        cv::operator*=((Mat *)&P,&stack0xfffffffffffffc30);
        cv::operator-=((Mat *)LBD_local,(Mat *)&P);
        ProxL0((Mat *)LBD_local,local_a0);
        InverseWaveletTransform2D((Mat *)LBD_local,(Mat *)local_140,Q,_ww,wh,&local_218,&local_21c);
        ProxRangeConstraint((Mat *)local_140,0.0,1.0);
        ProxMeanConstraint((Mat *)local_140,local_34);
        WaveletTransform2D((Mat *)local_140,(Mat *)LBD_local,Q,_ww,wh,&local_218,&local_21c,-1);
        local_3a0 = local_3a0 + 1;
        norm_error._3_1_ = patchSize_local._4_4_ <= local_3a0;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Stopped after ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3a0);
      poVar4 = std::operator<<(poVar4," iterations ");
      poVar4 = std::operator<<(poVar4," (max allowed was ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,patchSize_local._4_4_);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      cv::_InputArray::_InputArray(&local_3f0,(Mat *)LBD_local);
      p_Var3 = (_InputArray *)cv::noArray();
      dVar6 = (double)cv::norm(&local_3f0,4,p_Var3);
      cv::_InputArray::~_InputArray(&local_3f0);
      local_3d4 = (float)dVar6;
      if ((float)dVar6 < 1e-06) {
        local_3d4 = 1.0;
      }
      local_3f8 = (double)local_3d4;
      cv::operator/=((Mat *)LBD_local,&local_3f8);
      InverseWaveletTransform2D((Mat *)LBD_local,(Mat *)local_140,Q,_ww,wh,&local_218,&local_21c);
      cv::_InputArray::_InputArray(&local_410,(Mat *)local_140);
      cv::_InputOutputArray::_InputOutputArray(&local_428,(Mat *)LBD_local);
      p_Var3 = (_InputArray *)cv::noArray();
      cv::normalize(&local_410,&local_428,0.0,1.0,0x20,-1,p_Var3);
      cv::_InputOutputArray::~_InputOutputArray(&local_428);
      cv::_InputArray::~_InputArray(&local_410);
      if (Q != (double *)0x0) {
        operator_delete__(Q);
      }
      if (_ww != (double *)0x0) {
        operator_delete__(_ww);
      }
      cv::Mat::~Mat(local_2c0);
      cv::Mat::~Mat((Mat *)&P);
      cv::Mat::~Mat(local_1a0);
      cv::Mat::~Mat((Mat *)local_140);
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&M,"realDescriptor.type() == CV_32F",(allocator *)((long)&tau + 3));
    auVar7 = cv::error(-0xd7,(string *)&M,"RealReconstructionWithIHT",
                       "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                       ,0x313);
    local_6c = auVar7._8_4_;
    local_68 = auVar7._0_8_;
    std::allocator<char>::~allocator((allocator<char> *)((long)&tau + 3));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"norm == cv::NORM_L1 || norm == cv::NORM_L2",&local_59);
    auVar7 = cv::error(-0xd7,local_58,"RealReconstructionWithIHT",
                       "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                       ,0x312);
    local_6c = auVar7._8_4_;
    local_68 = auVar7._0_8_;
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  _Unwind_Resume(local_68);
}

Assistant:

void lts2::RealReconstructionWithIHT(cv::Mat &X, LBDOperator &LBD, cv::Mat const &realDescriptor,
                                     int iterations, float sparsityCoeff, cv::Size patchSize, float patchMean,
                                     int norm, std::string const &wavelet)
{
  CV_Assert(norm == cv::NORM_L1 || norm == cv::NORM_L2);
  CV_Assert(realDescriptor.type() == CV_32F);

  int const M = MAX(realDescriptor.rows, realDescriptor.cols);
  float const tau = (norm == cv::NORM_L2 ? 1.0/(float)M : 0.5/(float)M);

  sparsityCoeff = MAX(MIN(sparsityCoeff, 1.0), 0.0);
  int const K = (int)rintf( sparsityCoeff*patchSize.area() );

  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));

  cv::Mat X_im;
  cv::Mat Ax;
  cv::Mat nablaJ;

  // Wavelet basis
  double *P = NULL, *Q = NULL;
  int fsize = 0, ww, wh;
  lts2::WaveletCoef(wavelet, &P, &Q, &fsize);

  X_im.create(patchSize, CV_32F);
  X_im.setTo(cv::Scalar(patchMean));
  lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
  cv::Mat C0 = X(cv::Rect(0,0,ww,wh)).clone();
  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);

  // Special init if norm = L2
  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));
  if (norm == cv::NORM_L2)
  {
    LBD.ApplyConjugate(realDescriptor, X_im);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
    float norm_x = cv::norm(X);
    if (norm_x > 0.0) X /= norm_x;
  }

  bool hasConverged = false;
  int iter = 0;

  while (!hasConverged)
  {
    // Back from the wavelet world
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    LBD.Apply(X_im, Ax);
    Ax -= realDescriptor;

    // Step 1a : gradient
    if (norm == cv::NORM_L1)
    {
      float norm_error = cv::norm(Ax);
      norm_error = (norm_error > LTS2_EPSILON ? norm_error : 1.0);
      Ax /= norm_error;
    }

    LBD.ApplyConjugate(Ax, X_im);
    lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);
    nablaJ *= tau;

    X -= nablaJ;

    lts2::ProxL0(X, K);
    
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    lts2::ProxRangeConstraint(X_im, 0.0, 1.0);
    lts2::ProxMeanConstraint(X_im, patchMean);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);

    // Termination criterion
    hasConverged = (++iter >= iterations);  // Iterations count limit
    // TODO : test consistancy here (hasConverged |= ...)
  }

#ifdef DEBUG
  std::cout << "Stopped after " << iter << " iterations " << " (max allowed was " << iterations << ")" << std::endl;
#endif

  // Normalize by projecting to the sphere
  float norm_x = cv::norm(X);
  if (norm_x < LTS2_EPSILON)
    norm_x = 1.0;
  X /= norm_x;

  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
  cv::normalize(X_im, X, 0.0, 1.0, cv::NORM_MINMAX);

  // Cleanup
  delete[] P;
  delete[] Q;
}